

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi__uint32 stbi__get32be(stbi__context *s)

{
  byte bVar1;
  byte bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  
  bVar1 = stbi__get8(s);
  bVar2 = stbi__get8(s);
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  return (uint)CONCAT11(sVar3,sVar4) | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18;
}

Assistant:

static stbi__uint32 stbi__get32be(stbi__context *s)
{
   stbi__uint32 z = stbi__get16be(s);
   return (z << 16) + stbi__get16be(s);
}